

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

void enc(mpt_encode_array *arr,size_t len,void *data)

{
  mpt_array_push();
  mpt_array_push(arr,0,0);
  fputc(0x3c,_stdout);
  fputc(0x20,_stdout);
  disp(&arr->_d,(arr->_state).done);
  (*arr->_enc)(&arr->_state,(iovec *)0x0,(iovec *)0x0);
  return;
}

Assistant:

static void enc(MPT_STRUCT(encode_array) *arr, size_t len, const void *data)
{
	mpt_array_push(arr, len, data);
	mpt_array_push(arr, 0, 0);
	fputc('<',stdout);
	fputc(' ',stdout);
	disp(&arr->_d, arr->_state.done);
	arr->_enc(&arr->_state, 0, 0);
}